

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testinplacetext.cpp
# Opt level: O3

bool __thiscall
Am_Button_Panel_Text_Info::Am_Button_Panel_Text_Navigate::Move
          (Am_Button_Panel_Text_Navigate *this,Am_Inplace_Text_Direction direction)

{
  char cVar1;
  Am_Value *pAVar2;
  bool bVar3;
  Am_Value_List parts;
  Am_Value_List aAStack_28 [16];
  
  pAVar2 = (Am_Value *)Am_Object::Get((short)this->info + 0x18,0x82);
  Am_Value_List::Am_Value_List(aAStack_28,pAVar2);
  Am_Value_List::Start();
  Am_Object::operator_cast_to_Am_Wrapper_(&this->info->current_button);
  cVar1 = Am_Value_List::Member((Am_Wrapper *)aAStack_28);
  if (cVar1 == '\0') goto LAB_00108584;
  switch(direction) {
  case Am_INPLACE_UP:
  case Am_INPLACE_LEFT:
    Am_Value_List::Prev();
    cVar1 = Am_Value_List::First();
    goto LAB_00108580;
  case Am_INPLACE_DOWN:
  case Am_INPLACE_RIGHT:
    Am_Value_List::Next();
    cVar1 = Am_Value_List::Last();
LAB_00108580:
    if (cVar1 != '\0') {
LAB_00108584:
      bVar3 = false;
      goto LAB_001085dc;
    }
    break;
  case Am_INPLACE_PREV:
    Am_Value_List::Prev();
    cVar1 = Am_Value_List::First();
    if (cVar1 != '\0') {
      Am_Value_List::End();
    }
    break;
  case Am_INPLACE_NEXT:
    Am_Value_List::Next();
    cVar1 = Am_Value_List::Last();
    if (cVar1 != '\0') {
      Am_Value_List::Start();
    }
  }
  pAVar2 = (Am_Value *)Am_Value_List::Get();
  bVar3 = true;
  Am_Object::operator=(&this->info->current_button,pAVar2);
LAB_001085dc:
  Am_Value_List::~Am_Value_List(aAStack_28);
  return bVar3;
}

Assistant:

bool Move(Am_Inplace_Text_Direction direction) override
    {
      Am_Value_List parts = info->self.Get(Am_GRAPHICAL_PARTS);
      parts.Start();
      if (!parts.Member(info->current_button))
        return false;
      switch (direction) {
      case Am_INPLACE_PREV:
        parts.Prev();
        if (parts.First())
          parts.End();
        break;
      case Am_INPLACE_LEFT:
      case Am_INPLACE_UP:
        parts.Prev();
        if (parts.First())
          return false;
        break;
      case Am_INPLACE_NEXT:
        parts.Next();
        if (parts.Last())
          parts.Start();
        break;
      case Am_INPLACE_RIGHT:
      case Am_INPLACE_DOWN:
        parts.Next();
        if (parts.Last())
          return false;
        break;
      }
      info->current_button = parts.Get();
      return true;
    }